

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

PackageImportDeclarationSyntax * __thiscall
slang::parsing::Parser::parseImportDeclaration(Parser *this,AttrList attributes)

{
  bool bVar1;
  SourceLocation location;
  PackageImportItemSyntax *pPVar2;
  PackageImportDeclarationSyntax *pPVar3;
  Info *pIVar4;
  Info *extraout_RDX;
  Info *pIVar5;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *ctx;
  TokenKind TVar6;
  ulong uVar7;
  TokenKind kind;
  Token keyword;
  Token current_00;
  Token TVar8;
  Token semi;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_118;
  ulong local_108;
  undefined8 uStack_100;
  size_t local_f8;
  pointer local_f0;
  size_t local_e8;
  Token current;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> items;
  
  keyword = ParserBase::consume(&this->super_ParserBase);
  Token::Token(&semi);
  items.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
       (pointer)items.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement;
  items.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
  items.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 4;
  current_00 = ParserBase::peek(&this->super_ParserBase);
  current = current_00;
  bVar1 = slang::syntax::SyntaxFacts::isSemicolon(current_00.kind);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      location = Token::location(&current);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x490005,location);
    }
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isIdentifierOrComma(current_00.kind);
    if (!bVar1) {
      ParserBase::reportMissingList
                (&this->super_ParserBase,current_00,Semicolon,&semi,(DiagCode)0x490005);
      pIVar5 = extraout_RDX;
      goto LAB_0035d14d;
    }
    do {
      do {
        pIVar5 = current_00.info;
        pPVar2 = parsePackageImportItem(this);
        local_118._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pPVar2;
        local_108 = CONCAT71(local_108._1_7_,1);
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (&items.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                   (TokenOrSyntax *)&local_118._M_first);
        TVar8 = ParserBase::peek(&this->super_ParserBase);
        bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar8.kind);
        if (TVar8.kind != Comma || bVar1) goto LAB_0035d138;
        local_118._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        local_108 = local_108 & 0xffffffffffffff00;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (&items.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                   (TokenOrSyntax *)&local_118._M_first);
        TVar8 = ParserBase::peek(&this->super_ParserBase);
        pIVar4 = TVar8.info;
        kind = TVar8.kind;
        bVar1 = slang::syntax::SyntaxFacts::isSemicolon(kind);
        if (kind == EndOfFile || bVar1) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          goto LAB_0035d138;
        }
        TVar6 = current_00.kind;
        uVar7 = TVar8._0_8_ & 0xffffffff;
        current_00.info = pIVar4;
        current_00.kind = (short)uVar7;
        current_00._2_1_ = (char)(uVar7 >> 0x10);
        current_00.numFlags.raw = (char)(uVar7 >> 0x18);
        current_00.rawLen = (int)(uVar7 >> 0x20);
      } while (pIVar5 != pIVar4 || TVar6 != kind);
      bVar1 = ParserBase::
              skipBadTokens<&slang::syntax::SyntaxFacts::isIdentifierOrComma,&slang::syntax::SyntaxFacts::isSemicolon>
                        (&this->super_ParserBase,(DiagCode)0x490005,true);
      uVar7 = TVar8._0_8_ & 0xffffffff;
      current_00.kind = (short)uVar7;
      current_00._2_1_ = (char)(uVar7 >> 0x10);
      current_00.numFlags.raw = (char)(uVar7 >> 0x18);
      current_00.rawLen = (int)(uVar7 >> 0x20);
    } while (bVar1);
  }
LAB_0035d138:
  semi = ParserBase::expect(&this->super_ParserBase,Semicolon);
  pIVar5 = semi.info;
LAB_0035d14d:
  local_118._8_4_ = 1;
  local_108 = 0;
  uStack_100 = 0;
  local_118._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_00593670;
  local_f8 = attributes._M_extent._M_extent_value._M_extent_value;
  local_f0 = attributes._M_ptr;
  local_e8 = attributes._M_extent._M_extent_value._M_extent_value;
  SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
            (&items.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
             (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)pIVar5);
  current.info._0_4_ = 3;
  current._0_8_ = &PTR_getChild_00596fe8;
  pPVar3 = slang::syntax::SyntaxFactory::packageImportDeclaration
                     (&this->factory,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&local_118._M_first,
                      keyword,(SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *)
                              &current,semi);
  ctx = &local_118;
  local_118._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pPVar3;
  std::
  vector<slang::syntax::PackageImportDeclarationSyntax_const*,std::allocator<slang::syntax::PackageImportDeclarationSyntax_const*>>
  ::emplace_back<slang::syntax::PackageImportDeclarationSyntax_const*>
            ((vector<slang::syntax::PackageImportDeclarationSyntax_const*,std::allocator<slang::syntax::PackageImportDeclarationSyntax_const*>>
              *)&(this->meta).packageImports,(PackageImportDeclarationSyntax **)&ctx->_M_rest);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
            (&items.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
             (EVP_PKEY_CTX *)&ctx->_M_first);
  return pPVar3;
}

Assistant:

PackageImportDeclarationSyntax& Parser::parseImportDeclaration(AttrList attributes) {
    auto keyword = consume();

    Token semi;
    SmallVector<TokenOrSyntax, 4> items;
    parseList<isIdentifierOrComma, isSemicolon>(items, TokenKind::Semicolon, TokenKind::Comma, semi,
                                                RequireItems::True, diag::ExpectedPackageImport,
                                                [this] { return &parsePackageImportItem(); });

    auto& result = factory.packageImportDeclaration(attributes, keyword, items.copy(alloc), semi);
    meta.packageImports.push_back(&result);
    return result;
}